

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall ON_SubDFace::RemoveEdgeFromArray(ON_SubDFace *this,ON_SubDEdge *e)

{
  ushort uVar1;
  ulong uVar2;
  ON_SubDEdgePtr *pOVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  
  if (e == (ON_SubDEdge *)0x0) {
    return false;
  }
  uVar1 = this->m_edge_count;
  uVar2 = (ulong)uVar1;
  uVar6 = (uint)uVar1;
  if (uVar1 < 5) {
    if (uVar2 != 0) {
      uVar4 = 0;
      do {
        if ((ON_SubDEdge *)(this->m_edge4[uVar4].m_ptr & 0xfffffffffffffff8) == e) {
          if ((int)uVar4 + 1U < uVar6) {
            do {
              this->m_edge4[uVar4].m_ptr = this->m_edge4[uVar4 + 1].m_ptr;
              uVar4 = uVar4 + 1;
            } while (uVar1 - 1 != uVar4);
          }
          this->m_edge_count = uVar1 - 1;
          pOVar3 = this->m_edge4 + (ushort)(uVar1 - 1);
LAB_005d885e:
          pOVar3->m_ptr = 0;
          return true;
        }
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
  }
  else {
    uVar4 = 0;
    do {
      if ((ON_SubDEdge *)(this->m_edge4[uVar4].m_ptr & 0xfffffffffffffff8) == e) {
        if (uVar4 < 3) {
          do {
            this->m_edge4[uVar4].m_ptr = this->m_edge4[uVar4 + 1].m_ptr;
            uVar4 = uVar4 + 1;
          } while (uVar4 != 3);
        }
        pOVar3 = this->m_edgex;
        this->m_edge4[3].m_ptr = pOVar3->m_ptr;
        if (uVar1 != 5) {
          uVar2 = 6;
          if (6 < uVar1) {
            uVar2 = (ulong)uVar6;
          }
          memmove(pOVar3,pOVar3 + 1,uVar2 * 8 + 0x7ffffffd8 & 0x7fffffff8);
        }
        this->m_edge_count = (unsigned_short)(uVar6 - 1);
        pOVar3 = pOVar3 + ((ulong)(uVar6 - 1 & 0xffff) - 4);
        goto LAB_005d885e;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != 4);
    pOVar3 = this->m_edgex;
    lVar5 = 0;
    do {
      if ((ON_SubDEdge *)(pOVar3[lVar5].m_ptr & 0xfffffffffffffff8) == e) {
        if ((int)lVar5 + 5U < uVar6) {
          do {
            pOVar3[lVar5].m_ptr = pOVar3[lVar5 + 1].m_ptr;
            lVar5 = lVar5 + 1;
          } while ((ulong)(uVar1 - 1) - 4 != lVar5);
        }
        this->m_edge_count = (unsigned_short)(uVar6 - 1);
        pOVar3 = pOVar3 + ((ulong)(uVar6 - 1 & 0xffff) - 4);
        goto LAB_005d885e;
      }
      lVar5 = lVar5 + 1;
    } while (uVar2 - 4 != lVar5);
  }
  return false;
}

Assistant:

bool ON_SubDFace::RemoveEdgeFromArray(
  const ON_SubDEdge* e
  )
{
  unsigned int i;
  if (nullptr == e)
    return false;

  if (m_edge_count <= 4)
  {
    for (i = 0; i < m_edge_count; i++)
    {
      if (e == ON_SUBD_EDGE_POINTER(m_edge4[i].m_ptr))
      {
        for (i++; i < m_edge_count; i++)
          m_edge4[i - 1] = m_edge4[i];
        m_edge_count--;
        m_edge4[m_edge_count] = ON_SubDEdgePtr::Null;
        return true;
      }
    }
  }
  else
  {
    for (i = 0; i < 4; i++)
    {
      if (e == ON_SUBD_EDGE_POINTER(m_edge4[i].m_ptr))
      {
        for (i++; i < 4; i++)
          m_edge4[i - 1] = m_edge4[i];
        m_edge4[3] = m_edgex[0];
        for (i = 5; i < m_edge_count; i++)
          m_edgex[i - 5] = m_edgex[i - 4];
        m_edge_count--;
        m_edgex[m_edge_count-4] = ON_SubDEdgePtr::Null;
        return true;
      }
    }
    for (i = 4; i < m_edge_count; i++)
    {
      if (e == ON_SUBD_EDGE_POINTER(m_edgex[i - 4].m_ptr))
      {
        for (i++; i < m_edge_count; i++)
          m_edgex[i - 5] = m_edgex[i - 4];
        m_edge_count--;
        m_edgex[m_edge_count-4] = ON_SubDEdgePtr::Null;
        return true;
      }
    }
  }

  return false;
}